

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O2

void __thiscall miniros::Publisher::Impl::~Impl(Impl *this)

{
  allocator<char> local_29;
  string local_28;
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (~Impl::loc.initialized_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"miniros.unknown_package",&local_29);
    console::initializeLogLocation(&~Impl::loc,&local_28,Debug);
    std::__cxx11::string::~string((string *)&local_28);
  }
  if (~Impl::loc.level_ != Debug) {
    console::setLogLocationLevel(&~Impl::loc,Debug);
    console::checkLogLocationEnabled(&~Impl::loc);
  }
  if (~Impl::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,~Impl::loc.logger_,~Impl::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/publisher.cpp"
                   ,0x28,"miniros::Publisher::Impl::~Impl()",
                   "Publisher on \'%s\' deregistering callbacks.",(this->topic_)._M_dataplus._M_p);
  }
  unadvertise(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->callbacks_).
              super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->node_handle_).
              super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&this->datatype_);
  std::__cxx11::string::~string((string *)&this->md5sum_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Publisher::Impl::~Impl()
{
  MINIROS_DEBUG("Publisher on '%s' deregistering callbacks.", topic_.c_str());
  unadvertise();
}